

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O1

void see_wsegs(monst *worm)

{
  wseg *pwVar1;
  
  if ((ulong)worm->wormno != 0) {
    pwVar1 = level->wtails[worm->wormno];
    if (pwVar1 != level->wheads[worm->wormno]) {
      do {
        newsym((int)pwVar1->wx,(int)pwVar1->wy);
        pwVar1 = pwVar1->nseg;
      } while (pwVar1 != level->wheads[worm->wormno]);
    }
    return;
  }
  warning("see_wsegs: worm->wormno was 0");
  return;
}

Assistant:

void see_wsegs(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("see_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != level->wheads[worm->wormno]) {
	newsym(curr->wx,curr->wy);
	curr = curr->nseg;
    }
}